

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O2

bool IsTrDosDirSector(Sector *sector)

{
  bool bVar1;
  int iVar2;
  Data *pDVar3;
  ulong uVar4;
  TRDOS_DIR *pd_;
  bool bVar5;
  
  pDVar3 = Sector::data_copy(sector,0);
  bVar5 = false;
  if (((sector->header).sector == 1) && (bVar5 = false, (sector->header).size == 1)) {
    iVar2 = Sector::size(sector);
    uVar4 = (ulong)(long)iVar2 >> 4;
    pd_ = (TRDOS_DIR *)
          (pDVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    while( true ) {
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar5) break;
      bVar1 = IsTrDosDirEntry(pd_);
      if (!bVar1) {
        return bVar5;
      }
      pd_ = pd_ + 1;
    }
  }
  return bVar5;
}

Assistant:

bool IsTrDosDirSector(const Sector& sector)
{
    auto& data = sector.data_copy();

    // Check sector number and size
    if (sector.header.sector != 1 || sector.header.size != 1)
        return false;

    auto dir_entries = sector.size() / sizeof(TRDOS_DIR);
    auto pd = reinterpret_cast<const TRDOS_DIR*>(data.data());

    for (size_t entry = 0; entry < dir_entries; ++entry, ++pd)
    {
        if (!IsTrDosDirEntry(pd))
            return false;
    }

    return true;
}